

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

void __thiscall
despot::util::tinyxml::TiXmlElement::SetDoubleAttribute(TiXmlElement *this,char *name,double val)

{
  char local_128 [8];
  char buf [256];
  double val_local;
  char *name_local;
  TiXmlElement *this_local;
  
  snprintf(local_128,0x100,"%f",val);
  SetAttribute(this,name,local_128);
  return;
}

Assistant:

void TiXmlElement::SetDoubleAttribute(const char * name, double val) {
	char buf[256];
#if defined(TIXML_SNPRINTF)
	TIXML_SNPRINTF(buf, sizeof(buf), "%f", val);
#else
	sprintf( buf, "%f", val );
#endif
	SetAttribute(name, buf);
}